

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RandomNormalStaticLayerParams::SerializeWithCachedSizes
          (RandomNormalStaticLayerParams *this,CodedOutputStream *output)

{
  float fVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  unsigned_long *puVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  ulong value;
  ulong uVar9;
  int index;
  uint value_00;
  
  if (this->seed_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->seed_,output);
  }
  fVar1 = this->mean_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar1,output);
  }
  fVar1 = this->stddev_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar1,output);
  }
  if (0 < (this->outputshape_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x22);
      iVar4 = output->buffer_size_;
    }
    else {
      *output->buffer_ = '\"';
      output->buffer_ = output->buffer_ + 1;
      iVar4 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar4;
    }
    value_00 = this->_outputshape_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value_00);
    }
    else {
      pbVar2 = output->buffer_;
      pbVar7 = pbVar2;
      uVar8 = value_00;
      if (0x7f < value_00) {
        do {
          *pbVar7 = (byte)value_00 | 0x80;
          uVar8 = value_00 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < value_00;
          value_00 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar4 = ((int)pbVar7 - (int)pbVar2) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    iVar4 = (this->outputshape_).current_size_;
    if (0 < iVar4) {
      index = 0;
      do {
        puVar5 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->outputshape_,index);
        value = *puVar5;
        if (output->buffer_size_ < 10) {
          google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,value);
        }
        else {
          pbVar2 = output->buffer_;
          pbVar7 = pbVar2;
          uVar9 = value;
          if (0x7f < value) {
            do {
              *pbVar7 = (byte)value | 0x80;
              uVar9 = value >> 7;
              pbVar7 = pbVar7 + 1;
              bVar3 = 0x3fff < value;
              value = uVar9;
            } while (bVar3);
          }
          *pbVar7 = (byte)uVar9;
          iVar6 = ((int)pbVar7 - (int)pbVar2) + 1;
          output->buffer_ = output->buffer_ + iVar6;
          output->buffer_size_ = output->buffer_size_ - iVar6;
        }
        index = index + 1;
      } while (index != iVar4);
    }
  }
  return;
}

Assistant:

void RandomNormalStaticLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.RandomNormalStaticLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->seed() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->seed(), output);
  }

  // float mean = 2;
  if (this->mean() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->mean(), output);
  }

  // float stdDev = 3;
  if (this->stddev() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->stddev(), output);
  }

  // repeated uint64 outputShape = 4;
  if (this->outputshape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(4, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_outputshape_cached_byte_size_);
  }
  for (int i = 0, n = this->outputshape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->outputshape(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.RandomNormalStaticLayerParams)
}